

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ReferenceMemory::ReferenceMemory
          (ReferenceMemory *this,size_t size,size_t atomSize)

{
  allocator<unsigned_char> local_22;
  value_type_conflict4 local_21;
  size_t local_20;
  size_t atomSize_local;
  size_t size_local;
  ReferenceMemory *this_local;
  
  this->m_atomSize = atomSize;
  local_21 = 0xde;
  local_20 = atomSize;
  atomSize_local = size;
  size_local = (size_t)this;
  std::allocator<unsigned_char>::allocator(&local_22);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->m_bytes,size,&local_21,&local_22);
  std::allocator<unsigned_char>::~allocator(&local_22);
  BitVector::BitVector(&this->m_defined,atomSize_local,false);
  BitVector::BitVector(&this->m_flushed,atomSize_local / local_20,false);
  return;
}

Assistant:

ReferenceMemory (size_t size, size_t atomSize)
		: m_atomSize	(atomSize)
		, m_bytes		(size, 0xDEu)
		, m_defined		(size, false)
		, m_flushed		(size / atomSize, false)
	{
		DE_ASSERT(size % m_atomSize == 0);
	}